

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerMSL::get_argument_address_space_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRVariable *argument)

{
  bool bVar1;
  SPIRType *type;
  
  type = Variant::get<spirv_cross::SPIRType>
                   ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>.ptr +
                    *(uint *)&(argument->super_IVariant).field_0xc);
  bVar1 = Compiler::is_physical_pointer((Compiler *)this,type);
  if (bVar1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    get_type_address_space_abi_cxx11_
              (__return_storage_ptr__,this,type,(argument->super_IVariant).self.id,true);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::get_argument_address_space(const SPIRVariable &argument)
{
	const auto &type = get<SPIRType>(argument.basetype);
	// BDA is always passed around by value. There is no storage class for the argument itself.
	if (is_physical_pointer(type))
		return "";
	return get_type_address_space(type, argument.self, true);
}